

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O3

int knownhost_check(LIBSSH2_KNOWNHOSTS *hosts,char *hostp,int port,char *key,size_t keylen,
                   int typemask,libssh2_knownhost **ext)

{
  short sVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  list_node *plVar6;
  size_t datalen;
  list_node *plVar7;
  char *pcVar8;
  uint uVar9;
  LIBSSH2_SESSION *session;
  ulong uVar10;
  list_node *plVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char *keyalloc;
  uchar hash [20];
  EVP_MAC_CTX *ctx;
  char hostbuff [270];
  char *local_198;
  list_node *local_190;
  char *local_188;
  uint local_17c;
  list_head *local_178;
  char *local_170;
  char local_168;
  char cStack_167;
  char cStack_166;
  char cStack_165;
  char cStack_164;
  char cStack_163;
  char cStack_162;
  char cStack_161;
  char cStack_160;
  char cStack_15f;
  char cStack_15e;
  char cStack_15d;
  char cStack_15c;
  char cStack_15b;
  char cStack_15a;
  char cStack_159;
  undefined4 local_158;
  EVP_MAC_CTX *local_150;
  char local_148 [280];
  
  local_188 = (char *)0x0;
  if ((typemask & 0xffffU) == 2) {
    return 1;
  }
  pcVar8 = hostp;
  local_170 = hostp;
  if (port < 0) {
LAB_001159b3:
    local_198 = key;
    if (((uint)typemask >> 0x11 & 1) == 0) {
      sVar5 = _libssh2_base64_encode(hosts->session,key,keylen,&local_188);
      if (sVar5 == 0) {
        session = hosts->session;
        pcVar8 = "Unable to allocate memory for base64-encoded key";
        iVar4 = -6;
        goto LAB_00115c40;
      }
      local_198 = local_188;
    }
    uVar10 = (ulong)((uint)port >> 0x1f);
    local_178 = &hosts->head;
    uVar3 = typemask & 0x3c0000;
    local_190 = (list_node *)0x0;
    do {
      local_17c = (uint)uVar10;
      for (plVar6 = (list_node *)_libssh2_list_first(local_178); plVar6 != (list_node *)0x0;
          plVar6 = (list_node *)_libssh2_list_next(plVar6)) {
        sVar1 = *(short *)((long)&plVar6[1].head + 4);
        if (sVar1 == 3) {
          if ((typemask & 0xffffU) == 3) {
LAB_00115b15:
            iVar4 = strcmp(pcVar8,(char *)plVar6[1].next);
            bVar12 = iVar4 == 0;
LAB_00115b2a:
            if ((bVar12) &&
               ((uVar9 = *(uint *)((long)&plVar6[1].head + 4), uVar3 == 0 ||
                ((uVar3 != 0x3c0000 && (uVar3 == (uVar9 & 0x3c0000))))))) {
              plVar11 = (list_node *)plVar6[2].head;
              iVar4 = strcmp(local_198,(char *)plVar11);
              if (iVar4 == 0) {
                if (ext == (libssh2_knownhost **)0x0) {
                  iVar4 = 0;
                  goto LAB_00115c92;
                }
                *(undefined4 *)&plVar6[4].prev = 0xdeadcafe;
                plVar6[4].head = (list_head *)plVar6;
                iVar4 = 0;
                if ((short)uVar9 == 1) {
                  plVar7 = plVar6[1].next;
                }
                else {
                  plVar7 = (list_node *)0x0;
                }
                plVar6[5].next = plVar7;
                goto LAB_00115c82;
              }
              if (local_190 == (list_node *)0x0) {
                local_190 = plVar6;
              }
            }
          }
        }
        else if (sVar1 == 2) {
          if ((typemask & 0xffffU) == 1) {
            iVar4 = _libssh2_hmac_ctx_init(&local_150);
            bVar12 = false;
            if (((iVar4 != 0) && (plVar6[1].prev == (list_node *)0x14)) &&
               (iVar4 = _libssh2_hmac_sha1_init(&local_150,plVar6[2].next,(size_t)plVar6[2].prev),
               iVar4 != 0)) {
              datalen = strlen(pcVar8);
              iVar4 = _libssh2_hmac_update(&local_150,pcVar8,datalen);
              if ((iVar4 == 0) || (iVar4 = _libssh2_hmac_final(&local_150,&local_168), iVar4 == 0))
              {
                _libssh2_hmac_cleanup(&local_150);
                bVar12 = false;
              }
              else {
                _libssh2_hmac_cleanup(&local_150);
                plVar11 = plVar6[1].next;
                uVar2 = *(undefined4 *)&plVar11->head;
                auVar14[0] = -((char)uVar2 == (char)local_158);
                auVar14[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)local_158 >> 8));
                auVar14[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)local_158 >> 0x10));
                auVar14[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)local_158 >> 0x18));
                auVar14[4] = 0xff;
                auVar14[5] = 0xff;
                auVar14[6] = 0xff;
                auVar14[7] = 0xff;
                auVar14[8] = 0xff;
                auVar14[9] = 0xff;
                auVar14[10] = 0xff;
                auVar14[0xb] = 0xff;
                auVar14[0xc] = 0xff;
                auVar14[0xd] = 0xff;
                auVar14[0xe] = 0xff;
                auVar14[0xf] = 0xff;
                auVar13[0] = -(*(char *)&plVar11->next == local_168);
                auVar13[1] = -(*(char *)((long)&plVar11->next + 1) == cStack_167);
                auVar13[2] = -(*(char *)((long)&plVar11->next + 2) == cStack_166);
                auVar13[3] = -(*(char *)((long)&plVar11->next + 3) == cStack_165);
                auVar13[4] = -(*(char *)((long)&plVar11->next + 4) == cStack_164);
                auVar13[5] = -(*(char *)((long)&plVar11->next + 5) == cStack_163);
                auVar13[6] = -(*(char *)((long)&plVar11->next + 6) == cStack_162);
                auVar13[7] = -(*(char *)((long)&plVar11->next + 7) == cStack_161);
                auVar13[8] = -(*(char *)&plVar11->prev == cStack_160);
                auVar13[9] = -(*(char *)((long)&plVar11->prev + 1) == cStack_15f);
                auVar13[10] = -(*(char *)((long)&plVar11->prev + 2) == cStack_15e);
                auVar13[0xb] = -(*(char *)((long)&plVar11->prev + 3) == cStack_15d);
                auVar13[0xc] = -(*(char *)((long)&plVar11->prev + 4) == cStack_15c);
                auVar13[0xd] = -(*(char *)((long)&plVar11->prev + 5) == cStack_15b);
                auVar13[0xe] = -(*(char *)((long)&plVar11->prev + 6) == cStack_15a);
                auVar13[0xf] = -(*(char *)((long)&plVar11->prev + 7) == cStack_159);
                auVar13 = auVar13 & auVar14;
                bVar12 = (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff;
              }
            }
            goto LAB_00115b2a;
          }
        }
        else if ((sVar1 == 1) && ((typemask & 0xffffU) == 1)) goto LAB_00115b15;
      }
      uVar10 = CONCAT71((int7)(uVar10 >> 8),1);
      pcVar8 = local_170;
    } while ((local_17c & 1) == 0);
    if (local_190 == (list_node *)0x0) {
      iVar4 = 2;
    }
    else if (ext == (libssh2_knownhost **)0x0) {
      iVar4 = 1;
    }
    else {
      *(undefined4 *)&local_190[4].prev = 0xdeadcafe;
      local_190[4].head = (list_head *)local_190;
      uVar9 = *(uint *)((long)&local_190[1].head + 4);
      if ((short)uVar9 == 1) {
        plVar6 = local_190[1].next;
      }
      else {
        plVar6 = (list_node *)0x0;
      }
      local_190[5].next = plVar6;
      plVar11 = (list_node *)local_190[2].head;
      iVar4 = 1;
      plVar6 = local_190;
LAB_00115c82:
      plVar6[5].prev = plVar11;
      *(uint *)&plVar6[5].head = uVar9;
      *ext = (libssh2_knownhost *)&plVar6[4].prev;
    }
LAB_00115c92:
    if (local_188 != (char *)0x0) {
      (*hosts->session->free)(local_188,&hosts->session->abstract);
    }
  }
  else {
    pcVar8 = local_148;
    uVar3 = snprintf(pcVar8,0x10e,"[%s]:%d");
    if (uVar3 < 0x10e) goto LAB_001159b3;
    session = hosts->session;
    pcVar8 = "Known-host write buffer too small";
    iVar4 = -0x26;
LAB_00115c40:
    _libssh2_error(session,iVar4,pcVar8);
    iVar4 = 3;
  }
  return iVar4;
}

Assistant:

static int
knownhost_check(LIBSSH2_KNOWNHOSTS *hosts,
                const char *hostp, int port,
                const char *key, size_t keylen,
                int typemask,
                struct libssh2_knownhost **ext)
{
    struct known_host *node;
    struct known_host *badkey = NULL;
    int type = typemask & LIBSSH2_KNOWNHOST_TYPE_MASK;
    char *keyalloc = NULL;
    int rc = LIBSSH2_KNOWNHOST_CHECK_NOTFOUND;
    char hostbuff[270]; /* most host names can't be longer than like 256 */
    const char *host;
    int numcheck; /* number of host combos to check */
    int match = 0;

    if(type == LIBSSH2_KNOWNHOST_TYPE_SHA1)
        /* we can't work with a sha1 as given input */
        return LIBSSH2_KNOWNHOST_CHECK_MISMATCH;

    /* if a port number is given, check for a '[host]:port' first before the
       plain 'host' */
    if(port >= 0) {
        int len = snprintf(hostbuff, sizeof(hostbuff), "[%s]:%d", hostp, port);
        if(len < 0 || len >= (int)sizeof(hostbuff)) {
            _libssh2_error(hosts->session,
                           LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                           "Known-host write buffer too small");
            return LIBSSH2_KNOWNHOST_CHECK_FAILURE;
        }
        host = hostbuff;
        numcheck = 2; /* check both combos, start with this */
    }
    else {
        host = hostp;
        numcheck = 1; /* only check this host version */
    }

    if(!(typemask & LIBSSH2_KNOWNHOST_KEYENC_BASE64)) {
        /* we got a raw key input, convert it to base64 for the checks below */
        size_t nlen = _libssh2_base64_encode(hosts->session, key, keylen,
                                             &keyalloc);
        if(!nlen) {
            _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for base64-encoded "
                           "key");
            return LIBSSH2_KNOWNHOST_CHECK_FAILURE;
        }

        /* make the key point to this */
        key = keyalloc;
    }

    do {
        node = _libssh2_list_first(&hosts->head);
        while(node) {
            switch(node->typemask & LIBSSH2_KNOWNHOST_TYPE_MASK) {
            case LIBSSH2_KNOWNHOST_TYPE_PLAIN:
                if(type == LIBSSH2_KNOWNHOST_TYPE_PLAIN)
                    match = !strcmp(host, node->name);
                break;
            case LIBSSH2_KNOWNHOST_TYPE_CUSTOM:
                if(type == LIBSSH2_KNOWNHOST_TYPE_CUSTOM)
                    match = !strcmp(host, node->name);
                break;
            case LIBSSH2_KNOWNHOST_TYPE_SHA1:
                if(type == LIBSSH2_KNOWNHOST_TYPE_PLAIN) {
                    /* when we have the sha1 version stored, we can use a
                       plain input to produce a hash to compare with the
                       stored hash.
                    */
                    unsigned char hash[SHA_DIGEST_LENGTH];
                    libssh2_hmac_ctx ctx;
                    if(!_libssh2_hmac_ctx_init(&ctx))
                        break;

                    if(SHA_DIGEST_LENGTH != node->name_len) {
                        /* the name hash length must be the sha1 size or
                           we can't match it */
                        break;
                    }
                    if(!_libssh2_hmac_sha1_init(&ctx,
                                                node->salt, node->salt_len))
                        break;
                    if(!_libssh2_hmac_update(&ctx, host, strlen(host)) ||
                       !_libssh2_hmac_final(&ctx, hash)) {
                        _libssh2_hmac_cleanup(&ctx);
                        break;
                    }
                    _libssh2_hmac_cleanup(&ctx);

                    if(!memcmp(hash, node->name, SHA_DIGEST_LENGTH))
                        /* this is a node we're interested in */
                        match = 1;
                }
                break;
            default: /* unsupported type */
                break;
            }
            if(match) {
                int host_key_type = typemask & LIBSSH2_KNOWNHOST_KEY_MASK;
                int known_key_type =
                    node->typemask & LIBSSH2_KNOWNHOST_KEY_MASK;
                /* match on key type as follows:
                   - never match on an unknown key type
                   - if key_type is set to zero, ignore it an match always
                   - otherwise match when both key types are equal
                */
                if(host_key_type != LIBSSH2_KNOWNHOST_KEY_UNKNOWN &&
                     (host_key_type == 0 ||
                      host_key_type == known_key_type)) {
                    /* host name and key type match, now compare the keys */
                    if(!strcmp(key, node->key)) {
                        /* they match! */
                        if(ext)
                            *ext = knownhost_to_external(node);
                        badkey = NULL;
                        rc = LIBSSH2_KNOWNHOST_CHECK_MATCH;
                        break;
                    }
                    else {
                        /* remember the first node that had a host match but a
                           failed key match since we continue our search from
                           here */
                        if(!badkey)
                            badkey = node;
                    }
                }
                match = 0; /* don't count this as a match anymore */
            }
            node = _libssh2_list_next(&node->node);
        }
        host = hostp;
    } while(!match && --numcheck);

    if(badkey) {
        /* key mismatch */
        if(ext)
            *ext = knownhost_to_external(badkey);
        rc = LIBSSH2_KNOWNHOST_CHECK_MISMATCH;
    }

    if(keyalloc)
        LIBSSH2_FREE(hosts->session, keyalloc);

    return rc;
}